

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubtreeWrapper.cpp
# Opt level: O0

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CAndConditionalWrapper::ToConditional
          (CAndConditionalWrapper *this,CLabel *labelTrue,CLabel *labelFalse)

{
  CSeqStatement *this_00;
  pointer pIVar1;
  CSeqStatement *this_01;
  CLabelStatement *this_02;
  CLabel *in_RCX;
  CLabel local_148;
  CLabel local_128;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_108;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_100;
  undefined1 local_f1;
  CLabel local_f0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_d0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_c8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_c0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_b8;
  CLabel local_b0;
  CLabel local_90;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_70;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_68 [3];
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_50;
  undefined1 local_48 [8];
  CLabel labelMiddle;
  CLabel *labelFalse_local;
  CLabel *labelTrue_local;
  CAndConditionalWrapper *this_local;
  
  CLabel::CLabel((CLabel *)local_48);
  this_00 = (CSeqStatement *)operator_new(0x18);
  pIVar1 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
           operator->((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                       *)&labelTrue->field_0x8);
  CLabel::CLabel(&local_90,(CLabel *)local_48);
  CLabel::CLabel(&local_b0,in_RCX);
  (*pIVar1->_vptr_ISubtreeWrapper[2])(&local_70,pIVar1,&local_90,&local_b0);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (local_68,&local_70);
  this_01 = (CSeqStatement *)operator_new(0x18);
  this_02 = (CLabelStatement *)operator_new(0x28);
  local_f1 = 1;
  CLabel::CLabel(&local_f0,(CLabel *)local_48);
  CLabelStatement::CLabelStatement(this_02,&local_f0);
  local_f1 = 0;
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_d0,(pointer)this_02);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_c8,&local_d0);
  pIVar1 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
           operator->((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                       *)&labelTrue->field_0x10);
  CLabel::CLabel(&local_128,labelFalse);
  CLabel::CLabel(&local_148,in_RCX);
  (*pIVar1->_vptr_ISubtreeWrapper[2])(&local_108,pIVar1,&local_128,&local_148);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_100,&local_108);
  CSeqStatement::CSeqStatement(this_01,&local_c8,&local_100);
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_c0,(pointer)this_01);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_b8,&local_c0);
  CSeqStatement::CSeqStatement(this_00,local_68,&local_b8);
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_50,(pointer)this_00);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)this,
             &local_50);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_50);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_b8);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_c0);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_100);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_108);
  CLabel::~CLabel(&local_148);
  CLabel::~CLabel(&local_128);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_c8);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_d0);
  CLabel::~CLabel(&local_f0);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (local_68);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_70);
  CLabel::~CLabel(&local_b0);
  CLabel::~CLabel(&local_90);
  CLabel::~CLabel((CLabel *)local_48);
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement> CAndConditionalWrapper::ToConditional( CLabel labelTrue, CLabel labelFalse ) {
        CLabel labelMiddle;
        return std::move( std::unique_ptr<const CStatement>(
                new CSeqStatement(
                        std::move( operandLeft->ToConditional( labelMiddle, labelFalse )),
                        std::move( std::unique_ptr<const CStatement>(
                                new CSeqStatement(
                                        std::move( std::unique_ptr<const CStatement>(
                                                new CLabelStatement( labelMiddle ))),
                                        std::move( operandRight->ToConditional( labelTrue, labelFalse ))
                                )
                        ))
                )
        ));
    }